

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObservation.cpp
# Opt level: O0

void __thiscall test_CEObservation::test_CEObservation(test_CEObservation *this)

{
  CEObserver *in_RDI;
  CEBody *body;
  CEObservation *this_00;
  CEObserver *in_stack_fffffffffffffd58;
  CEObservation *other;
  CEObserver *in_stack_fffffffffffffd60;
  CEBody *in_stack_fffffffffffffd70;
  CEDateType date_format;
  CEObservation *this_01;
  CEDate *date;
  CEObserver *this_02;
  double *in_stack_fffffffffffffd98;
  double *in_stack_fffffffffffffda0;
  double *in_stack_fffffffffffffda8;
  CEObserver *in_stack_fffffffffffffdb0;
  undefined1 local_1b9 [177];
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  undefined4 local_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  
  CETestSuite::CETestSuite((CETestSuite *)in_RDI);
  *(undefined ***)&in_RDI->_vptr_CEObserver = &PTR__test_CEObservation_00151590;
  this_02 = (CEObserver *)&in_RDI[3].latitude_;
  CEBody::CEBody(in_stack_fffffffffffffd70);
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffd70 >> 0x20);
  date = (CEDate *)&in_RDI[3].pos_icrs_;
  body = (CEBody *)CEDate::CurrentJD();
  CEDate::CEDate((CEDate *)body,(double)date,date_format);
  this_01 = (CEObservation *)
            &in_RDI[3].vel_icrs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  CEObserver::CEObserver(this_02);
  CEObservation::CEObservation(this_01);
  local_d0 = 0;
  local_d8 = 0;
  local_e0 = 0;
  local_e4 = 0;
  CEObserver::CEObserver
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd98,(CEAngleType *)this_02);
  CEObserver::operator=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  CEObserver::~CEObserver(in_stack_fffffffffffffd60);
  local_f0 = 0.0;
  CEObserver::SetTemperature_C
            ((CEObserver *)
             &in_RDI[3].vel_icrs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_f0);
  local_f8 = 0.0;
  CEObserver::SetPressure_hPa
            ((CEObserver *)
             &in_RDI[3].vel_icrs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_f8);
  local_100 = 0.0;
  CEObserver::SetRelativeHumidity
            ((CEObserver *)
             &in_RDI[3].vel_icrs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_100);
  local_108 = 0.0;
  CEObserver::SetWavelength_um
            ((CEObserver *)
             &in_RDI[3].vel_icrs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_108);
  this_00 = (CEObservation *)CppEphem::julian_date_J2000();
  CEDate::CEDate((CEDate *)body,(double)date,(CEDateType)((ulong)this_01 >> 0x20));
  CEDate::operator=((CEDate *)this_00,(CEDate *)in_stack_fffffffffffffd58);
  CEDate::~CEDate((CEDate *)0x11d0b2);
  CEDate::SetReturnType((CEDate *)&in_RDI[3].pos_icrs_,JD);
  other = (CEObservation *)local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1b9 + 1),"test",(allocator *)other);
  CEAngle::Deg(in_stack_fffffffffffffd98);
  CEAngle::Deg(in_stack_fffffffffffffd98);
  CEBody::CEBody((CEBody *)this_02,(string *)in_RDI,(CEAngle *)body,(CEAngle *)date,
                 (CESkyCoordType *)this_01);
  CEBody::operator=((CEBody *)this_00,(CEBody *)other);
  CEBody::~CEBody((CEBody *)this_00);
  CEAngle::~CEAngle((CEAngle *)0x11d1b3);
  CEAngle::~CEAngle((CEAngle *)0x11d1c0);
  std::__cxx11::string::~string((string *)(local_1b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b9);
  CEObservation::CEObservation((CEObservation *)this_02,in_RDI,body,date);
  CEObservation::operator=(this_00,other);
  CEObservation::~CEObservation(this_00);
  return;
}

Assistant:

test_CEObservation::test_CEObservation() :
    CETestSuite()
{
    // Setup the observer
    base_observer_ = CEObserver(0.0, 0.0, 0.0, CEAngleType::DEGREES);
    base_observer_.SetTemperature_C(0.0);
    base_observer_.SetPressure_hPa(0.0);
    base_observer_.SetRelativeHumidity(0.0);
    base_observer_.SetWavelength_um(0.0);

    // Setup the date
    base_date_ = CEDate(CppEphem::julian_date_J2000(), CEDateType::JD);
    base_date_.SetReturnType(CEDateType::JD);

    // Set the object that will be observed
    base_body_ = CEBody("test", CEAngle::Deg(83.663), CEAngle::Deg(22.0145), 
                        CESkyCoordType::ICRS);
    
    // Put it all together
    base_obs_ = CEObservation(&base_observer_, &base_body_, &base_date_);
}